

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O1

string * __thiscall
cppcms::session_interface::get_session_cookie_abi_cxx11_
          (string *__return_storage_ptr__,session_interface *this)

{
  session_interface_cookie_adapter *psVar1;
  cached_settings *pcVar2;
  request *this_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
  *this_01;
  const_iterator cVar3;
  cached_cookies *__k;
  
  check(this);
  pcVar2 = cached_settings(this);
  __k = &(pcVar2->session).cookies;
  psVar1 = ((this->d).ptr_)->adapter;
  if (psVar1 == (session_interface_cookie_adapter *)0x0) {
    this_00 = http::context::request(this->context_);
    this_01 = &http::request::cookies_abi_cxx11_(this_00)->_M_t;
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
            ::find(this_01,&__k->prefix);
    if ((_Rb_tree_header *)cVar3._M_node == &(this_01->_M_impl).super__Rb_tree_header) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      http::cookie::value_abi_cxx11_(__return_storage_ptr__,(cookie *)(cVar3._M_node + 2));
    }
  }
  else {
    (*psVar1->_vptr_session_interface_cookie_adapter[3])(__return_storage_ptr__,psVar1,__k);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string session_interface::get_session_cookie()
{
	check();
	std::string const &name=cached_settings().session.cookies.prefix;
	if(d->adapter) {
		return d->adapter->get_session_cookie(name);
	}
	else {
		http::request::cookies_type const &cookies = context_->request().cookies();
		http::request::cookies_type::const_iterator p=cookies.find(name);
		if(p==cookies.end())
			return std::string();
		return p->second.value();
	}
}